

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2Bug3061120(void)

{
  bool bVar1;
  RE2 re;
  LogMessage local_268;
  RE2 local_e8;
  
  RE2::RE2(&local_e8,"(?i)\\W");
  local_268._0_8_ = "x";
  local_268._8_4_ = 1;
  bVar1 = RE2::PartialMatchN((StringPiece *)&local_268,&local_e8,(Arg **)0x0,0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c7,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_268 + 8),"Check failed: !(RE2::PartialMatch(\"x\", re))",
               0x2b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_268);
  }
  local_268._0_8_ = "k";
  local_268._8_4_ = 1;
  bVar1 = RE2::PartialMatchN((StringPiece *)&local_268,&local_e8,(Arg **)0x0,0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c8,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_268 + 8),"Check failed: !(RE2::PartialMatch(\"k\", re))",
               0x2b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_268);
  }
  local_268._0_8_ = "s";
  local_268._8_4_ = 1;
  bVar1 = RE2::PartialMatchN((StringPiece *)&local_268,&local_e8,(Arg **)0x0,0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c9,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_268 + 8),"Check failed: !(RE2::PartialMatch(\"s\", re))",
               0x2b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_268);
  }
  RE2::~RE2(&local_e8);
  return;
}

Assistant:

TEST(RE2, Bug3061120) {
  RE2 re("(?i)\\W");
  EXPECT_FALSE(RE2::PartialMatch("x", re));  // always worked
  EXPECT_FALSE(RE2::PartialMatch("k", re));  // broke because of kelvin
  EXPECT_FALSE(RE2::PartialMatch("s", re));  // broke because of latin long s
}